

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O1

void __thiscall DROPlayer::DoFileEnd(DROPlayer *this)

{
  PLAYER_EVENT_CB UNRECOVERED_JUMPTABLE;
  UINT32 UVar1;
  
  if ((this->_playState & 8) != 0) {
    UVar1 = (*(this->super_PlayerBase)._vptr_PlayerBase[0x15])(this,(ulong)this->_fileTick);
    this->_playSmpl = UVar1;
  }
  this->_playState = this->_playState | 2;
  this->_psTrigger = this->_psTrigger | 2;
  UNRECOVERED_JUMPTABLE = (this->super_PlayerBase)._eventCbFunc;
  if (UNRECOVERED_JUMPTABLE != (PLAYER_EVENT_CB)0x0) {
    (*UNRECOVERED_JUMPTABLE)
              (&this->super_PlayerBase,(this->super_PlayerBase)._eventCbParam,'\x04',(void *)0x0);
    return;
  }
  return;
}

Assistant:

void DROPlayer::DoFileEnd(void)
{
	if (_playState & PLAYSTATE_SEEK)	// recalculate playSmpl to fix state when triggering callbacks
		_playSmpl = Tick2Sample(_fileTick);	// Note: fileTick results in more accurate position
	_playState |= PLAYSTATE_END;
	_psTrigger |= PLAYSTATE_END;
	if (_eventCbFunc != NULL)
		_eventCbFunc(this, _eventCbParam, PLREVT_END, NULL);
	
	return;
}